

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void track_char(CHAR_DATA *ch,CHAR_DATA *mob)

{
  short sVar1;
  bool bVar2;
  long in_RSI;
  long in_RDI;
  __type_conflict2 _Var3;
  EXIT_DATA *pexit;
  short track_dir;
  bool found;
  int i;
  undefined1 in_stack_000016ea;
  undefined1 in_stack_000016eb;
  int in_stack_000016ec;
  CHAR_DATA *in_stack_000016f0;
  void *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  ulong uVar4;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffffe0;
  int local_14;
  
  if (*(long *)(in_RSI + 0xa8) != 0) {
    bVar2 = false;
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      if ((*(long *)(*(long *)(in_RSI + 0xa8) + 0x68 + (long)local_14 * 8) != 0) &&
         (**(long **)(*(long *)(in_RSI + 0xa8) + 0x68 + (long)local_14 * 8) == in_RDI)) {
        bVar2 = true;
        break;
      }
    }
    if ((bVar2) && (**(long **)(*(long *)(in_RSI + 0xa8) + 0x68 + (long)local_14 * 8) == in_RDI)) {
      sVar1 = *(short *)(*(long *)(*(long *)(in_RSI + 0xa8) + 0x68 + (long)local_14 * 8) + 0x20);
      bVar2 = is_affected_by(in_stack_ffffffffffffffd8,
                             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
      if (!bVar2) {
        ch_00 = *(CHAR_DATA **)(in_RSI + 0x180);
        _Var3 = std::pow<int,int>(0,0x56a83f);
        if (((ulong)ch_00 & (long)_Var3) == 0) {
          act(in_stack_ffffffffffffffe0,ch_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0)
          ;
          uVar4 = *(ulong *)(in_RSI + 0x2c0);
          _Var3 = std::pow<int,int>(0,0x56a892);
          if (((uVar4 & (long)_Var3) == 0) && (sVar1 != -1)) {
            move_char(in_stack_000016f0,in_stack_000016ec,(bool)in_stack_000016eb,
                      (bool)in_stack_000016ea);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void track_char(CHAR_DATA *ch, CHAR_DATA *mob)
{
	if (mob->in_room == nullptr)
		return;

	auto i = 0;
	auto found = false;
	for (; i < MAX_TRACKS; i++)
	{
		if (mob->in_room->tracks[i] && mob->in_room->tracks[i]->prey == ch)
		{
			found = true;
			break;
		}
	}

	if (!found)
		return;

	if (mob->in_room->tracks[i]->prey != ch)
		return;

	auto track_dir = mob->in_room->tracks[i]->direction;

	if (is_affected_by(mob, AFF_CHARM))
		return;

	if (IS_SET(mob->act, ACT_SENTINEL))
		return;

	act("$n checks the ground for tracks.", mob, 0, 0, TO_ROOM);

	if (IS_SET(mob->off_flags, STATIC_TRACKING) || track_dir == -1)
		return;

	auto pexit = mob->in_room->exit[track_dir];

	move_char(mob, track_dir, false, true);
}